

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederateManager::getEndpoint(MessageFederateManager *this,string_view name)

{
  string_view searchValue;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> ept;
  handle sharedEpt;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>
  *in_stack_ffffffffffffff58;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *in_stack_ffffffffffffff60;
  undefined1 *puVar2;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff98;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffa0;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> local_48;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  local_30;
  size_t local_10;
  char *pcStack_8;
  
  local_10 = in_RSI;
  pcStack_8 = in_RDX;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffff98);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator->(&local_30);
  searchValue._M_str = pcStack_8;
  searchValue._M_len = local_10;
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffffa0,searchValue);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::end((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
         *)in_stack_ffffffffffffff60);
  bVar1 = gmlc::containers::BlockIterator<helics::Endpoint,32,helics::Endpoint**>::operator!=
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    puVar2 = (undefined1 *)
             gmlc::containers::BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::operator*
                       (&local_48);
  }
  else {
    puVar2 = invalidEptNC;
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                  *)0x36cd54);
  return (Endpoint *)puVar2;
}

Assistant:

Endpoint& MessageFederateManager::getEndpoint(std::string_view name)
{
    auto sharedEpt = mLocalEndpoints.lock();
    auto ept = sharedEpt->find(name);
    return (ept != sharedEpt.end()) ? (*ept) : invalidEptNC;
}